

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void mon_adjust_speed(monst *mon,int adjust,obj *obj)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *howmuch;
  uint oldspeed;
  boolean petrify;
  boolean give_msg;
  obj *otmp;
  obj *obj_local;
  int adjust_local;
  monst *mon_local;
  
  bVar6 = in_mklev == '\0';
  bVar1 = false;
  uVar3 = *(uint *)&mon->field_0x60 >> 10 & 3;
  switch(adjust) {
  case 0:
    break;
  case 1:
    if ((*(uint *)&mon->field_0x60 >> 0xc & 3) == 1) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff;
    }
    else {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff | 0x2000;
    }
    break;
  case 2:
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff | 0x2000;
    bVar6 = false;
    break;
  case -3:
    if ((*(uint *)&mon->field_0x60 >> 0xc & 3) == 2) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff;
    }
    bVar1 = true;
    break;
  case -2:
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff | 0x1000;
    bVar6 = false;
    break;
  case -1:
    if ((*(uint *)&mon->field_0x60 >> 0xc & 3) == 2) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff;
    }
    else {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffffcfff | 0x1000;
    }
  }
  _oldspeed = mon->minvent;
  while ((_oldspeed != (obj *)0x0 &&
         ((_oldspeed->owornmask == 0 || (objects[_oldspeed->otyp].oc_oprop != '\x1a'))))) {
    _oldspeed = _oldspeed->nobj;
  }
  if (_oldspeed == (obj *)0x0) {
    *(uint *)&mon->field_0x60 =
         *(uint *)&mon->field_0x60 & 0xfffff3ff | (*(uint *)&mon->field_0x60 >> 0xc & 3) << 10;
  }
  else {
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffff3ff | 0x800;
  }
  if (!bVar6) {
    return;
  }
  if (((*(uint *)&mon->field_0x60 >> 10 & 3) == uVar3) && (!bVar1)) {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_003426b6;
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return;
    }
    if ((mon->data->mflags3 & 0x200) == 0) {
      return;
    }
    bVar2 = viz_array[mon->my][mon->mx] & 1;
  }
  else {
    bVar2 = worm_known(level,mon);
  }
  if (bVar2 == 0) {
    return;
  }
LAB_003426b6:
  if (((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
      ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
     ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) &&
      (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar4 = "";
    if ((*(uint *)&mon->field_0x60 >> 10 & 3) + uVar3 == 3) {
      pcVar4 = "much ";
    }
    if (bVar1) {
      if (flags.verbose != '\0') {
        pcVar4 = Monnam(mon);
        pline("%s is slowing down.",pcVar4);
      }
    }
    else if ((adjust < 1) && ((*(uint *)&mon->field_0x60 >> 10 & 3) != 2)) {
      pcVar5 = Monnam(mon);
      pline("%s seems to be moving %sslower.",pcVar5,pcVar4);
    }
    else {
      pcVar5 = Monnam(mon);
      pline("%s is suddenly moving %sfaster.",pcVar5,pcVar4);
    }
    if (obj != (obj *)0x0) {
      if ((obj->oprops & 0x20U) == 0) {
        if (((*(uint *)&obj->field_0x4a >> 5 & 1) != 0) && (objects[obj->otyp].oc_class != '\n')) {
          discover_object((int)obj->otyp,'\x01','\x01');
        }
      }
      else {
        obj->oprops_known = obj->oprops_known | 0x20;
      }
    }
  }
  return;
}

Assistant:

void mon_adjust_speed(struct monst *mon,
		      int adjust, /* positive => increase speed, negative => decrease */
		      struct obj *obj)	/* item to make known if effect can be seen */
{
    struct obj *otmp;
    boolean give_msg = !in_mklev, petrify = FALSE;
    unsigned int oldspeed = mon->mspeed;

    switch (adjust) {
     case  2:
	mon->permspeed = MFAST;
	give_msg = FALSE;	/* special case monster creation */
	break;
     case  1:
	if (mon->permspeed == MSLOW) mon->permspeed = 0;
	else mon->permspeed = MFAST;
	break;
     case  0:			/* just check for worn speed boots */
	break;
     case -1:
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	else mon->permspeed = MSLOW;
	break;
     case -2:
	mon->permspeed = MSLOW;
	give_msg = FALSE;	/* (not currently used) */
	break;
     case -3:			/* petrification */
	/* take away intrinsic speed but don't reduce normal speed */
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	petrify = TRUE;
	break;
    }

    for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
	if (otmp->owornmask && objects[otmp->otyp].oc_oprop == FAST)
	    break;
    if (otmp)		/* speed boots */
	mon->mspeed = MFAST;
    else
	mon->mspeed = mon->permspeed;

    if (give_msg && (mon->mspeed != oldspeed || petrify) && canseemon(level, mon)) {
	/* fast to slow (skipping intermediate state) or vice versa */
	const char *howmuch = (mon->mspeed + oldspeed == MFAST + MSLOW) ?
				"much " : "";

	if (petrify) {
	    /* mimic the player's petrification countdown; "slowing down"
	       even if fast movement rate retained via worn speed boots */
	    if (flags.verbose) pline("%s is slowing down.", Monnam(mon));
	} else if (adjust > 0 || mon->mspeed == MFAST)
	    pline("%s is suddenly moving %sfaster.", Monnam(mon), howmuch);
	else
	    pline("%s seems to be moving %sslower.", Monnam(mon), howmuch);

	/* might discover an object if we see the speed change happen, but
	   avoid making possibly forgotten book known when casting its spell */
	if (obj) {
	    if (obj->oprops & ITEM_SPEED)
		obj->oprops_known |= ITEM_SPEED;
	    else if (obj->dknown && objects[obj->otyp].oc_class != SPBOOK_CLASS)
		makeknown(obj->otyp);
	}
    }
}